

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
               VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  _Var1;
  deUint32 y;
  uint z_00;
  TestStatus *pTVar2;
  deUint32 z;
  uint uVar3;
  deUint32 x;
  uint y_00;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> distinctValues;
  IVec4 pixel;
  allocator<char> local_7d;
  uint local_7c;
  _Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_78;
  TestStatus *local_58;
  string local_50;
  
  local_7c = (this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.
             numSamples + VK_SAMPLE_COUNT_1_BIT;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (Vector<int,_4> *)0x0;
  local_58 = __return_storage_ptr__;
  for (uVar3 = 0; uVar3 < (imageRSInfo->extent).depth; uVar3 = uVar3 + 1) {
    for (z_00 = 0; z_00 < (imageRSInfo->extent).height; z_00 = z_00 + 1) {
      for (y_00 = 0; y_00 < (imageRSInfo->extent).width; y_00 = y_00 + 1) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&local_50,(int)dataRS,y_00,z_00);
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<tcu::Vector<int,4>*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>,__gnu_cxx::__ops::_Iter_equals_val<tcu::Vector<int,4>const>>
                          (local_78._M_impl.super__Vector_impl_data._M_start,
                           local_78._M_impl.super__Vector_impl_data._M_finish,
                           (ConstPixelBufferAccess *)&local_50);
        if (_Var1._M_current == local_78._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&local_78
                     ,(value_type *)&local_50);
        }
      }
    }
  }
  if ((ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
              (long)local_78._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)local_7c) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Expected numSamples+1 different colors in the output image",
               &local_7d);
    pTVar2 = local_58;
    tcu::TestStatus::fail(local_58,&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Passed",&local_7d);
    pTVar2 = local_58;
    tcu::TestStatus::pass(local_58,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&local_78);
  return pTVar2;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceDistinctValues>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	const deUint32 distinctValuesExpected = static_cast<deUint32>(m_imageMSParams.numSamples) + 1u;

	std::vector<tcu::IVec4> distinctValues;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;	 ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;	 ++x)
	{
		const tcu::IVec4 pixel = dataRS.getPixelInt(x, y, z);

		if (std::find(distinctValues.begin(), distinctValues.end(), pixel) == distinctValues.end())
			distinctValues.push_back(pixel);
	}

	if (distinctValues.size() >= distinctValuesExpected)
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Expected numSamples+1 different colors in the output image");
}